

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O3

void predict_or_learn<false>(bs *d,single_learner *base,example *ec)

{
  pointer *ppdVar1;
  uint64_t *initial;
  uint64_t *puVar2;
  int iVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  pointer pdVar5;
  iterator __position;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  ostream *poVar8;
  vw_exception *this;
  ulong uVar9;
  float fVar10;
  float fVar11;
  stringstream __msg;
  stringstream outputStringStream;
  undefined1 in_stack_fffffffffffffc68 [12];
  float fVar12;
  vw *all;
  undefined1 *in_stack_fffffffffffffc80;
  undefined1 local_370 [16];
  string local_360;
  double local_340 [2];
  ostream local_330;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  all = d->all;
  iVar3 = all->raw_prediction;
  fVar12 = ec->weight;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pvVar4 = d->pred_vec;
  pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar5) {
    (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar5;
  }
  if (d->B != 0) {
    initial = &all->random_state;
    uVar9 = 0;
    do {
      fVar10 = merand48(initial);
      fVar11 = 0.0;
      if (((((((0.36787945 < fVar10) && (fVar11 = 1.0, 0.7357589 < fVar10)) &&
             (fVar11 = 2.0, 0.9196986 < fVar10)) &&
            ((fVar11 = 3.0, 0.98101187 < fVar10 && (fVar11 = 4.0, 0.99634016 < fVar10)))) &&
           ((fVar11 = 5.0, 0.9994058 < fVar10 &&
            ((fVar11 = 6.0, 0.99991673 < fVar10 && (fVar11 = 7.0, 0.99998975 < fVar10)))))) &&
          (fVar11 = 8.0, 0.99999887 < fVar10)) &&
         (((((fVar11 = 9.0, 0.9999999 < fVar10 && (fVar11 = 10.0, 1.0 < fVar10)) &&
            (fVar11 = 11.0, 1.0 < fVar10)) &&
           (((fVar11 = 12.0, 1.0 < fVar10 && (fVar11 = 13.0, 1.0 < fVar10)) &&
            ((fVar11 = 14.0, 1.0 < fVar10 &&
             ((fVar11 = 15.0, 1.0 < fVar10 && (fVar11 = 16.0, 1.0 < fVar10)))))))) &&
          (fVar11 = 17.0, 1.0 < fVar10)))) {
        fVar11 = 18.0;
        if (1.0 < fVar10) {
          fVar11 = 20.0;
        }
      }
      ec->weight = fVar11 * fVar12;
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar9);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar9);
      pvVar4 = d->pred_vec;
      local_340[0] = (double)(ec->pred).scalar;
      __position._M_current =
           (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pvVar4,__position,local_340);
      }
      else {
        *__position._M_current = local_340[0];
        ppdVar1 = &(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppdVar1 = *ppdVar1 + 1;
      }
      uVar9 = uVar9 + 1;
      if (0 < iVar3) {
        if (1 < uVar9) {
          local_340[0] = (double)CONCAT71(local_340[0]._1_7_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_340,1);
        }
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        local_340[0] = (double)CONCAT71(local_340[0]._1_7_,0x3a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_340,1);
        std::ostream::_M_insert<double>((double)ec->partial_prediction);
      }
    } while (uVar9 < d->B);
  }
  ec->weight = fVar12;
  if (d->bs_type == 0) {
    bs_predict_mean(all,ec,d->pred_vec);
  }
  else {
    if (d->bs_type != 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_330,"Unknown bs_type specified: ",0x1b);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/bs.cc"
                 ,0xdf,&local_360);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    bs_predict_vote(ec,d->pred_vec);
  }
  if (0 < iVar3) {
    p_Var6 = all->print_text;
    iVar3 = all->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar7._end._4_4_ = fVar12;
    vVar7._0_12_ = in_stack_fffffffffffffc68;
    vVar7.end_array = (char *)all;
    vVar7.erase_count = (size_t)in_stack_fffffffffffffc80;
    (*p_Var6)(iVar3,(string)ec->tag,vVar7);
    if (in_stack_fffffffffffffc80 != local_370) {
      operator_delete(in_stack_fffffffffffffc80);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void predict_or_learn(bs& d, single_learner& base, example& ec)
{
  vw& all = *d.all;
  bool shouldOutput = all.raw_prediction > 0;

  float weight_temp = ec.weight;

  stringstream outputStringStream;
  d.pred_vec->clear();

  for (size_t i = 1; i <= d.B; i++)
  {
    ec.weight = weight_temp * (float)BS::weight_gen(all);

    if (is_learn)
      base.learn(ec, i - 1);
    else
      base.predict(ec, i - 1);

    d.pred_vec->push_back(ec.pred.scalar);

    if (shouldOutput)
    {
      if (i > 1)
        outputStringStream << ' ';
      outputStringStream << i << ':' << ec.partial_prediction;
    }
  }

  ec.weight = weight_temp;

  switch (d.bs_type)
  {
    case BS_TYPE_MEAN:
      bs_predict_mean(all, ec, *d.pred_vec);
      break;
    case BS_TYPE_VOTE:
      bs_predict_vote(ec, *d.pred_vec);
      break;
    default:
      THROW("Unknown bs_type specified: " << d.bs_type);
  }

  if (shouldOutput)
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
}